

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

int parse_args_DSSS(Context_conflict *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  parse_destination_token(ctx);
  require_comma(ctx);
  iVar1 = parse_source_token_maybe_relative(ctx,1);
  require_comma(ctx);
  iVar2 = parse_source_token_maybe_relative(ctx,1);
  require_comma(ctx);
  iVar3 = parse_source_token_maybe_relative(ctx,1);
  return iVar3 + iVar2 + iVar1 + 2;
}

Assistant:

static int parse_args_DSSS(Context *ctx)
{
    int retval = 1;
    retval += parse_destination_token(ctx, &ctx->dest_arg);
    retval += parse_source_token(ctx, &ctx->source_args[0]);
    retval += parse_source_token(ctx, &ctx->source_args[1]);
    retval += parse_source_token(ctx, &ctx->source_args[2]);
    return retval;
}